

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O1

deBool deSocketAddressToBsdAddress
                 (deSocketAddress *address,size_t bsdAddrBufSize,sockaddr *bsdAddr,
                 NativeSocklen *bsdAddrLen)

{
  ushort uVar1;
  addrinfo *__ai;
  uint uVar2;
  uint uVar4;
  int iVar3;
  sockaddr_in *addr4;
  deBool dVar5;
  addrinfo *result;
  addrinfo hints;
  addrinfo *local_60;
  addrinfo local_58;
  
  *(undefined8 *)(bsdAddrBufSize + 0xc) = 0;
  *(undefined8 *)(bsdAddrBufSize + 0x14) = 0;
  *(undefined8 *)bsdAddrBufSize = 0;
  *(undefined8 *)(bsdAddrBufSize + 8) = 0;
  if (address->host == (char *)0x0) {
    if (address->family == DE_SOCKETFAMILY_INET6) {
      uVar1 = (ushort)address->port;
      *(ushort *)(bsdAddrBufSize + 2) = uVar1 << 8 | uVar1 >> 8;
      *(undefined2 *)bsdAddrBufSize = 10;
      bsdAddr->sa_family = 0x1c;
      bsdAddr->sa_data[0] = '\0';
      bsdAddr->sa_data[1] = '\0';
    }
    else {
      if (address->family != DE_SOCKETFAMILY_INET4) {
        return 0;
      }
      uVar1 = (ushort)address->port;
      *(ushort *)(bsdAddrBufSize + 2) = uVar1 << 8 | uVar1 >> 8;
      *(undefined2 *)bsdAddrBufSize = 2;
      *(undefined4 *)(bsdAddrBufSize + 4) = 0;
      bsdAddr->sa_family = 0x10;
      bsdAddr->sa_data[0] = '\0';
      bsdAddr->sa_data[1] = '\0';
    }
LAB_0011e6fd:
    dVar5 = 1;
  }
  else {
    local_60 = (addrinfo *)0x0;
    local_58.ai_canonname = (char *)0x0;
    local_58.ai_next = (addrinfo *)0x0;
    local_58.ai_addrlen = 0;
    local_58._20_4_ = 0;
    local_58.ai_addr = (sockaddr *)0x0;
    dVar5 = 0;
    uVar4 = 10;
    if (address->family != DE_SOCKETFAMILY_INET6) {
      uVar4 = 0;
    }
    uVar2 = 2;
    if (address->family != DE_SOCKETFAMILY_INET4) {
      uVar2 = uVar4;
    }
    local_58._0_8_ = (ulong)uVar2 << 0x20;
    local_58.ai_socktype = 1;
    if (address->type != DE_SOCKETTYPE_STREAM) {
      local_58.ai_socktype = (uint)(address->type == DE_SOCKETTYPE_DATAGRAM) * 2;
    }
    iVar3 = 0x11;
    if (address->protocol != DE_SOCKETPROTOCOL_UDP) {
      iVar3 = 0;
    }
    local_58.ai_protocol = 6;
    if (address->protocol != DE_SOCKETPROTOCOL_TCP) {
      local_58.ai_protocol = iVar3;
    }
    iVar3 = getaddrinfo(address->host,(char *)0x0,&local_58,&local_60);
    __ai = local_60;
    if (iVar3 == 0 && local_60 != (addrinfo *)0x0) {
      uVar4 = local_60->ai_addrlen;
      if (uVar4 < 0x1d) {
        bsdAddr->sa_family = (short)uVar4;
        bsdAddr->sa_data[0] = (char)(uVar4 >> 0x10);
        bsdAddr->sa_data[1] = (char)(uVar4 >> 0x18);
        memcpy((void *)bsdAddrBufSize,local_60->ai_addr,(ulong)local_60->ai_addrlen);
        freeaddrinfo(__ai);
        if (*(short *)bsdAddrBufSize == 10) {
          uVar4._0_2_ = bsdAddr->sa_family;
          uVar4._2_1_ = bsdAddr->sa_data[0];
          uVar4._3_1_ = bsdAddr->sa_data[1];
          if (uVar4 < 0x1c) {
            return 0;
          }
        }
        else {
          if (*(short *)bsdAddrBufSize != 2) {
            return 0;
          }
          uVar2._0_2_ = bsdAddr->sa_family;
          uVar2._2_1_ = bsdAddr->sa_data[0];
          uVar2._3_1_ = bsdAddr->sa_data[1];
          if (uVar2 < 0x10) {
            return 0;
          }
        }
        uVar1 = (ushort)address->port;
        *(ushort *)(bsdAddrBufSize + 2) = uVar1 << 8 | uVar1 >> 8;
        goto LAB_0011e6fd;
      }
    }
    else if (local_60 == (addrinfo *)0x0) {
      return 0;
    }
    freeaddrinfo(local_60);
  }
  return dVar5;
}

Assistant:

static deBool deSocketAddressToBsdAddress (const deSocketAddress* address, size_t bsdAddrBufSize, struct sockaddr* bsdAddr, NativeSocklen* bsdAddrLen)
{
	deMemset(bsdAddr, 0, bsdAddrBufSize);

	/* Resolve host. */
	if (address->host != DE_NULL)
	{
		struct addrinfo*	result	= DE_NULL;
		struct addrinfo		hints;

		deMemset(&hints, 0, sizeof(hints));
		hints.ai_family		= deSocketFamilyToBsdFamily(address->family);
		hints.ai_socktype	= deSocketTypeToBsdType(address->type);
		hints.ai_protocol	= deSocketProtocolToBsdProtocol(address->protocol);

		if (getaddrinfo(address->host, DE_NULL, &hints, &result) != 0 || !result)
		{
			if (result)
				freeaddrinfo(result);
			return DE_FALSE;
		}

		/* \note Always uses first address. */

		if (bsdAddrBufSize < (size_t)result->ai_addrlen)
		{
			DE_FATAL("Too small bsdAddr buffer");
			freeaddrinfo(result);
			return DE_FALSE;
		}

		*bsdAddrLen	= (NativeSocklen)result->ai_addrlen;

		deMemcpy(bsdAddr, result->ai_addr, (size_t)result->ai_addrlen);
		freeaddrinfo(result);

		/* Add port. */
		if (bsdAddr->sa_family == AF_INET)
		{
			if (*bsdAddrLen < (NativeSocklen)sizeof(struct sockaddr_in))
				return DE_FALSE;
			((struct sockaddr_in*)bsdAddr)->sin_port = deHostToNetworkOrder16((deUint16)address->port);
		}
		else if (bsdAddr->sa_family == AF_INET6)
		{
			if (*bsdAddrLen < (NativeSocklen)sizeof(struct sockaddr_in6))
				return DE_FALSE;
			((struct sockaddr_in6*)bsdAddr)->sin6_port = deHostToNetworkOrder16((deUint16)address->port);
		}
		else
			return DE_FALSE;

		return DE_TRUE;
	}
	else if (address->family == DE_SOCKETFAMILY_INET4)
	{
		struct sockaddr_in* addr4 = (struct sockaddr_in*)bsdAddr;

		if (bsdAddrBufSize < sizeof(struct sockaddr_in))
		{
			DE_FATAL("Too small bsdAddr buffer");
			return DE_FALSE;
		}

		addr4->sin_port			= deHostToNetworkOrder16((deUint16)address->port);
		addr4->sin_family		= AF_INET;
		addr4->sin_addr.s_addr	= INADDR_ANY;

		*bsdAddrLen	= (NativeSocklen)sizeof(struct sockaddr_in);

		return DE_TRUE;
	}
	else if (address->family == DE_SOCKETFAMILY_INET6)
	{
		struct sockaddr_in6* addr6 = (struct sockaddr_in6*)bsdAddr;

		if (bsdAddrBufSize < sizeof(struct sockaddr_in6))
		{
			DE_FATAL("Too small bsdAddr buffer");
			return DE_FALSE;
		}

		addr6->sin6_port	= deHostToNetworkOrder16((deUint16)address->port);
		addr6->sin6_family	= AF_INET6;

		*bsdAddrLen	= (NativeSocklen)sizeof(struct sockaddr_in6);

		return DE_TRUE;
	}
	else
		return DE_FALSE;
}